

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-cmp.cpp
# Opt level: O0

void floats(void)

{
  size_t unaff_retaddr;
  rtosc_arg_val_t *in_stack_00000008;
  rtosc_arg_val_t *in_stack_00000010;
  rtosc_arg_val_t *in_stack_00000018;
  rtosc_cmp_options very_tolerant;
  int in_stack_00000028;
  char *in_stack_00000030;
  char *in_stack_00000038;
  int in_stack_00000040;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  rtosc_cmp_options *in_stack_fffffffffffffff0;
  size_t in_stack_fffffffffffffff8;
  rtosc_cmp_options *opt;
  
  r[0].type = 'f';
  l[0].type = 'f';
  l[0].val.i = 0x3f800000;
  r[0].val.i = -0x40800000;
  cmp_gt(in_stack_00000010,in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8,
         in_stack_fffffffffffffff0,
         (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
         (char *)CONCAT44(very_tolerant.float_tolerance._4_4_,very_tolerant.float_tolerance._0_4_),
         in_stack_00000028);
  opt = (rtosc_cmp_options *)0x4000000000000000;
  cmp_1(very_tolerant.float_tolerance._4_4_,in_stack_00000018,in_stack_00000010,
        (size_t)in_stack_00000008,unaff_retaddr,(rtosc_cmp_options *)0x4000000000000000,
        in_stack_00000030,in_stack_00000038,in_stack_00000040);
  cmp_1(very_tolerant.float_tolerance._4_4_,in_stack_00000018,in_stack_00000010,
        (size_t)in_stack_00000008,unaff_retaddr,opt,in_stack_00000030,in_stack_00000038,
        in_stack_00000040);
  return;
}

Assistant:

void floats()
{
    l[0].type = r[0].type = 'f';
    l[0].val.f = 1.0f;
    r[0].val.f = -1.0f;

    cmp_gt(l, r, 1, 1, NULL, "1.0f", "-1.0f", __LINE__);

    rtosc_cmp_options very_tolerant = { 2.0 };

    cmp_1(eq, l, r, 1, 1, &very_tolerant,
          "1.0f", "-1.0f (2.0 tolerance)", __LINE__);
    cmp_1(eq, r, l, 1, 1, &very_tolerant,
          "-1.0f", "1.0f (2.0 tolerance)", __LINE__);
}